

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O1

bool __thiscall QHostInfoLookupManager::wasAborted(QHostInfoLookupManager *this,int id)

{
  QMutex *pQVar1;
  long lVar2;
  __pointer_type pQVar3;
  long lVar4;
  long lVar5;
  long in_RCX;
  long lVar6;
  bool bVar7;
  
  pQVar1 = &this->mutex;
  if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    in_RCX = 1;
    LOCK();
    bVar7 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar7) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar7) goto LAB_001b0e9d;
  }
  else {
LAB_001b0e9d:
    QBasicMutex::lockInternal();
  }
  bVar7 = true;
  if (this->wasDeleted != false) goto LAB_001b0f03;
  lVar4 = (this->abortedLookups).d.size;
  if (lVar4 == 0) {
LAB_001b0ef4:
    in_RCX = -1;
  }
  else {
    lVar6 = -4;
    do {
      lVar2 = lVar4 * -4 + lVar6;
      if (lVar2 == -4) goto LAB_001b0eee;
      in_RCX = lVar6 + 4;
      lVar5 = lVar6 + 4;
      lVar6 = in_RCX;
    } while (*(int *)((long)(this->abortedLookups).d.ptr + lVar5) != id);
    in_RCX = in_RCX >> 2;
LAB_001b0eee:
    if (lVar2 == -4) goto LAB_001b0ef4;
  }
  bVar7 = in_RCX != -1;
LAB_001b0f03:
  LOCK();
  pQVar3 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar3 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(pQVar1);
  }
  return bVar7;
}

Assistant:

bool QHostInfoLookupManager::wasAborted(int id)
{
    QMutexLocker locker(&this->mutex);

    if (wasDeleted)
        return true;

    return abortedLookups.contains(id);
}